

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O0

FT_Error FT_Set_Pixel_Sizes(FT_Face face,FT_UInt pixel_width,FT_UInt pixel_height)

{
  FT_Error FVar1;
  undefined1 local_38 [8];
  FT_Size_RequestRec req;
  FT_UInt pixel_height_local;
  FT_UInt pixel_width_local;
  FT_Face face_local;
  
  req.horiResolution = pixel_height;
  req.vertResolution = pixel_height;
  if ((pixel_width != 0) && (req.vertResolution = pixel_width, pixel_height == 0)) {
    req.horiResolution = pixel_width;
  }
  if (req.vertResolution == 0) {
    req.vertResolution = 1;
  }
  if (req.horiResolution == 0) {
    req.horiResolution = 1;
  }
  if (0xfffe < req.vertResolution) {
    req.vertResolution = 0xffff;
  }
  if (0xfffe < req.horiResolution) {
    req.horiResolution = 0xffff;
  }
  local_38._0_4_ = FT_SIZE_REQUEST_TYPE_NOMINAL;
  req._0_8_ = ZEXT48(req.vertResolution << 6);
  req.width = (FT_Long)(req.horiResolution << 6);
  req.height._0_4_ = 0;
  req.height._4_4_ = 0;
  FVar1 = FT_Request_Size(face,(FT_Size_Request)local_38);
  return FVar1;
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_Set_Pixel_Sizes( FT_Face  face,
                      FT_UInt  pixel_width,
                      FT_UInt  pixel_height )
  {
    FT_Size_RequestRec  req;


    /* check of `face' delayed to `FT_Request_Size' */

    if ( pixel_width == 0 )
      pixel_width = pixel_height;
    else if ( pixel_height == 0 )
      pixel_height = pixel_width;

    if ( pixel_width  < 1 )
      pixel_width  = 1;
    if ( pixel_height < 1 )
      pixel_height = 1;

    /* use `>=' to avoid potential compiler warning on 16bit platforms */
    if ( pixel_width >= 0xFFFFU )
      pixel_width = 0xFFFFU;
    if ( pixel_height >= 0xFFFFU )
      pixel_height = 0xFFFFU;

    req.type           = FT_SIZE_REQUEST_TYPE_NOMINAL;
    req.width          = (FT_Long)( pixel_width << 6 );
    req.height         = (FT_Long)( pixel_height << 6 );
    req.horiResolution = 0;
    req.vertResolution = 0;

    return FT_Request_Size( face, &req );
  }